

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  bool bVar5;
  _Bool *done_00;
  _Bool _Var6;
  char cVar7;
  CURLcode CVar8;
  int iVar9;
  imapstate iVar10;
  curl_off_t cVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  _Bool *p_Var15;
  char *pcVar16;
  Curl_easy *data;
  char *pcVar17;
  char *pcVar18;
  char *value;
  char *name;
  char *local_58;
  char *local_50;
  connectdata *local_48;
  size_t local_40;
  _Bool *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  pcVar16 = (pCVar2->state).path;
  lVar14 = 1;
  pcVar18 = pcVar16 + -1;
  local_38 = done;
  do {
    pcVar17 = pcVar18;
    pcVar18 = pcVar17 + 1;
    _Var6 = imap_is_bchar(pcVar17[1]);
    lVar14 = lVar14 + -1;
  } while (_Var6);
  if (lVar14 == 0) {
    *(undefined8 *)((long)pvVar3 + 8) = 0;
  }
  else {
    pcVar12 = pcVar18;
    if ((pcVar16 < pcVar18) && (pcVar12 = pcVar17, *pcVar17 != '/')) {
      pcVar12 = pcVar18;
    }
    CVar8 = Curl_urldecode(pCVar2,pcVar16,(long)pcVar12 - (long)pcVar16,(char **)((long)pvVar3 + 8),
                           (size_t *)0x0,true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  cVar7 = *pcVar18;
  while (cVar7 == ';') {
    pcVar16 = pcVar18 + 1;
    pcVar17 = pcVar18 + 2;
    sVar13 = 0;
    pcVar18 = pcVar16;
    while( true ) {
      if (pcVar17[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar17[-1] == '=') break;
      pcVar17 = pcVar17 + 1;
      sVar13 = sVar13 + 1;
      pcVar18 = pcVar18 + 1;
    }
    local_48 = conn;
    CVar8 = Curl_urldecode(pCVar2,pcVar16,sVar13,&local_50,(size_t *)0x0,true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    sVar13 = 0xffffffffffffffff;
    do {
      pcVar16 = pcVar18 + 1;
      pcVar18 = pcVar18 + 1;
      _Var6 = imap_is_bchar(*pcVar16);
      sVar13 = sVar13 + 1;
    } while (_Var6);
    CVar8 = Curl_urldecode(pCVar2,pcVar17,sVar13,&local_58,&local_40,true);
    if (CVar8 != CURLE_OK) {
      (*Curl_cfree)(local_50);
      return CVar8;
    }
    iVar9 = Curl_strcasecompare(local_50,"UIDVALIDITY");
    if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x10) != 0)) {
      iVar9 = Curl_strcasecompare(local_50,"UID");
      if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x18) != 0)) {
        iVar9 = Curl_strcasecompare(local_50,"SECTION");
        conn = local_48;
        if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x20) != 0)) {
          iVar9 = Curl_strcasecompare(local_50,"PARTIAL");
          if ((iVar9 == 0) || (*(long *)((long)pvVar3 + 0x28) != 0)) {
            (*Curl_cfree)(local_50);
            (*Curl_cfree)(local_58);
            return CURLE_URL_MALFORMAT;
          }
          if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
            local_58[local_40 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x28) = local_58;
        }
        else {
          if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
            local_58[local_40 - 1] = '\0';
          }
          *(char **)((long)pvVar3 + 0x20) = local_58;
        }
      }
      else {
        if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
          local_58[local_40 - 1] = '\0';
        }
        *(char **)((long)pvVar3 + 0x18) = local_58;
        conn = local_48;
      }
    }
    else {
      if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
        local_58[local_40 - 1] = '\0';
      }
      *(char **)((long)pvVar3 + 0x10) = local_58;
      conn = local_48;
    }
    local_58 = (char *)0x0;
    (*Curl_cfree)(local_50);
    (*Curl_cfree)(local_58);
    cVar7 = *pcVar18;
  }
  if (((*(long *)((long)pvVar3 + 8) != 0) && (cVar7 == '?')) &&
     (*(long *)((long)pvVar3 + 0x18) == 0)) {
    sVar13 = 0xffffffffffffffff;
    do {
      _Var6 = imap_is_bchar(pcVar18[sVar13 + 2]);
      sVar13 = sVar13 + 1;
    } while (_Var6);
    CVar8 = Curl_urldecode(pCVar2,pcVar18 + 1,sVar13,(char **)((long)pvVar3 + 0x30),(size_t *)0x0,
                           true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    cVar7 = (pcVar18 + 1)[sVar13];
  }
  done_00 = local_38;
  if (cVar7 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar2 = conn->data;
  pcVar16 = (pCVar2->set).str[6];
  if (pcVar16 != (char *)0x0) {
    pvVar3 = (pCVar2->req).protop;
    CVar8 = Curl_urldecode(pCVar2,pcVar16,0,(char **)((long)pvVar3 + 0x38),(size_t *)0x0,true);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    pcVar16 = *(char **)((long)pvVar3 + 0x38);
    pcVar18 = pcVar16;
    for (; *pcVar16 != '\0'; pcVar16 = pcVar16 + 1) {
      if (*pcVar16 == ' ') {
        pcVar16 = (*Curl_cstrdup)(pcVar16);
        *(char **)((long)pvVar3 + 0x40) = pcVar16;
        *pcVar18 = '\0';
        if (*(long *)((long)pvVar3 + 0x40) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar18 = pcVar18 + 1;
    }
  }
  pCVar2 = conn->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if ((pCVar2->set).opt_no_body == true) {
    *puVar4 = 1;
  }
  *done_00 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar16 = (conn->proto).imapc.mailbox, pcVar16 == (char *)0x0)) ||
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar16), iVar9 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar16 = (conn->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0)) &&
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar16), iVar9 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  data = conn->data;
  if (((data->set).upload != false) || ((pCVar2->set).mimepost.kind != MIMEKIND_NONE)) {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar16 = "Cannot APPEND without a mailbox.";
      goto LAB_00130f47;
    }
    if ((data->set).mimepost.kind == MIMEKIND_NONE) {
      cVar11 = (data->state).infilesize;
    }
    else {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      CVar8 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      pcVar16 = Curl_checkheaders(conn,"Mime-Version");
      if ((pcVar16 == (char *)0x0) &&
         (CVar8 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
         CVar8 != CURLE_OK)) {
        return CVar8;
      }
      CVar8 = Curl_mime_rewind(part);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      cVar11 = Curl_mime_size(part);
      (data->state).infilesize = cVar11;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if (cVar11 < 0) {
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar16 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar16 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar8 = imap_sendf(conn,"APPEND %s (\\Seen) {%ld}",pcVar16,(data->state).infilesize);
    (*Curl_cfree)(pcVar16);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar10 = IMAP_APPEND;
LAB_00130fad:
    (conn->proto).imapc.state = iVar10;
    goto LAB_0013112f;
  }
  if (*(long *)(puVar4 + 0xe) == 0) {
    if (!bVar5) {
      if (*(long *)(puVar4 + 2) != 0) {
        if (*(long *)(puVar4 + 6) == 0) {
          lVar14 = *(long *)(puVar4 + 0xc);
          goto joined_r0x00131074;
        }
        goto LAB_0013107a;
      }
      goto LAB_0013111d;
    }
    if (*(long *)(puVar4 + 6) == 0) {
      if (*(long *)(puVar4 + 0xc) == 0) goto LAB_0013111d;
      CVar8 = imap_perform_search(conn);
    }
    else {
      CVar8 = imap_perform_fetch(conn);
    }
  }
  else {
    if (!bVar5) {
      lVar14 = *(long *)(puVar4 + 2);
joined_r0x00131074:
      if (lVar14 != 0) {
LAB_0013107a:
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn->proto).imapc.mailbox);
        (conn->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar16 = *(char **)((long)pvVar3 + 8);
        if (pcVar16 == (char *)0x0) {
          data = conn->data;
          pcVar16 = "Cannot SELECT without a mailbox.";
LAB_00130f47:
          Curl_failf(data,pcVar16);
          return CURLE_URL_MALFORMAT;
        }
        pcVar16 = imap_atom(pcVar16,false);
        if (pcVar16 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar8 = imap_sendf(conn,"SELECT %s",pcVar16);
        (*Curl_cfree)(pcVar16);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        iVar10 = IMAP_SELECT;
        goto LAB_00130fad;
      }
    }
LAB_0013111d:
    CVar8 = imap_perform_list(conn);
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_0013112f:
  p_Var15 = done_00;
  CVar8 = imap_multi_statemach(conn,done_00);
  if (CVar8 == CURLE_OK) {
    CVar8 = CURLE_OK;
    if (*done_00 == true) {
      imap_dophase_done(conn,SUB81(p_Var15,0));
      CVar8 = CURLE_OK;
    }
  }
  return CVar8;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}